

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O1

vec2 vec2_isometric_projection(vec2 v,float scale,float angle)

{
  vec2 vVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 local_38;
  undefined4 uStack_34;
  
  fVar2 = cosf(angle);
  uStack_34 = v.y;
  fVar3 = sinf(angle);
  local_38 = v.x;
  fVar4 = cosf(angle);
  fVar5 = sinf(angle);
  vVar1.y = (fVar4 * uStack_34 + fVar5 * local_38) * scale;
  vVar1.x = fVar2 * local_38 - fVar3 * uStack_34;
  return vVar1;
}

Assistant:

vec2 vec2_isometric_projection(vec2 v, float scale, float angle) {
    vec2 vp;

    vp = vec2_rotate(v, angle);
    vp.y *= scale;

    return vp;
}